

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_append_string_with_len(JSON_Array *array,char *string,size_t len)

{
  JSON_Status JVar1;
  JSON_Array *array_00;
  JSON_Value *in_RDX;
  char *in_RSI;
  JSON_Value *value;
  undefined4 local_4;
  
  array_00 = (JSON_Array *)json_value_init_string_with_len(in_RSI,(size_t)in_RDX);
  if (array_00 == (JSON_Array *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_array_append_value(array_00,(JSON_Value *)0x2863c5);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free(in_RDX);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_array_append_string_with_len(JSON_Array *array, const char *string, size_t len) {
    JSON_Value *value = json_value_init_string_with_len(string, len);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}